

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_output_variable_initializer(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  ExecutionModel EVar3;
  TypedID<(spirv_cross::Types)1> TVar4;
  uint32_t uVar5;
  size_t sVar6;
  SPIRType *pSVar7;
  TypedID *pTVar8;
  SPIRConstant *pSVar9;
  uint local_644;
  byte local_631;
  anon_class_56_4_2d78aa25 local_630;
  function<void_()> local_5f8;
  undefined1 local_5d8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598 [32];
  spirv_cross local_578 [8];
  string lut_name_2;
  anon_class_16_2_633bb654 local_558;
  function<void_()> local_548;
  uint32_t local_528;
  uint32_t local_524;
  anon_class_48_3_1ada460c local_520;
  function<void_()> local_4f0;
  undefined1 local_4d0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  spirv_cross local_470 [8];
  string lut_name_1;
  anon_class_64_8_a0f897ec local_450;
  function<void_()> local_410;
  uint local_3ec;
  spirv_cross local_3e8 [4];
  uint32_t j_1;
  undefined1 local_3c8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388 [32];
  undefined1 local_368 [44];
  uint32_t j;
  SPIRConstant *c;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  exprs;
  undefined1 local_218 [8];
  SPIRType array_type;
  SPIRType *member_type;
  uint32_t member_type_id;
  spirv_cross local_a0 [32];
  string local_80 [8];
  string lut_name;
  uint local_50;
  uint local_4c;
  uint32_t i;
  uint32_t iteration_count;
  uint32_t array_size;
  bool type_is_array;
  uint32_t member_count;
  bool is_control_point;
  uint32_t local_30;
  bool is_block;
  SPIRType *pSStack_28;
  bool is_patch;
  SPIRType *type;
  SPIRFunction *entry_func;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  entry_func = (SPIRFunction *)var;
  var_local = (SPIRVariable *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_Compiler).ir.default_entry_point);
  type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>(&this->super_Compiler,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry_func->super_IVariant).field_0xc)
  ;
  pSStack_28 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
  local_30 = (entry_func->super_IVariant).self.id;
  is_block = Compiler::has_decoration(&this->super_Compiler,(ID)local_30,DecorationPatch);
  member_count = (pSStack_28->super_IVariant).self.id;
  is_control_point =
       Compiler::has_decoration(&this->super_Compiler,(ID)member_count,DecorationBlock);
  EVar3 = Compiler::get_execution_model(&this->super_Compiler);
  local_631 = 0;
  if (EVar3 == ExecutionModelTessellationControl) {
    local_631 = is_block ^ 0xff;
  }
  type_is_array = (bool)(local_631 & 1);
  uVar2 = (uint32_t)this;
  if ((is_control_point & 1U) == 0) {
    if (type_is_array == false) {
      local_524 = (entry_func->super_IVariant).self.id;
      bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)local_524,DecorationBuiltIn);
      if (bVar1) {
        local_528 = (entry_func->super_IVariant).self.id;
        uVar5 = Compiler::get_decoration(&this->super_Compiler,(ID)local_528,DecorationBuiltIn);
        if (uVar5 == 0x14) {
          pSVar7 = type + 2;
          local_558.var = (SPIRVariable *)entry_func;
          local_558.this = this;
          ::std::function<void()>::
          function<spirv_cross::CompilerGLSL::emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::__2,void>
                    ((function<void()> *)&local_548,&local_558);
          SmallVector<std::function<void_()>,_0UL>::push_back
                    ((SmallVector<std::function<void_()>,_0UL> *)pSVar7,&local_548);
          ::std::function<void_()>::~function(&local_548);
          return;
        }
      }
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
                (local_578,(char (*) [2])0x40fecd,&(entry_func->super_IVariant).self,
                 (char (*) [6])"_init");
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_598,this,pSStack_28,0);
      pSVar7 = pSStack_28;
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(entry_func->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[0x27])(local_5d8 + 0x20,this,pSVar7,(ulong)uVar5);
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&entry_func->arguments);
      to_expression_abi_cxx11_((CompilerGLSL *)local_5d8,uVar2,SUB41(uVar5,0));
      statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,(char (*) [7])0x41738f,local_598,(char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_578,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_5d8 + 0x20),(char (*) [4])0x4247a7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d8,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_5d8);
      ::std::__cxx11::string::~string((string *)(local_5d8 + 0x20));
      ::std::__cxx11::string::~string((string *)local_598);
      pSVar7 = type + 2;
      ::std::__cxx11::string::string((string *)&local_630,(string *)local_578);
      local_630.is_patch = (bool)(is_block & 1);
      local_630.var = (SPIRVariable *)entry_func;
      local_630.this = this;
      ::std::function<void()>::
      function<spirv_cross::CompilerGLSL::emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::__3,void>
                ((function<void()> *)&local_5f8,&local_630);
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)pSVar7,&local_5f8);
      ::std::function<void_()>::~function(&local_5f8);
      emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::$_3::~__3
                ((__3 *)&local_630);
      ::std::__cxx11::string::~string((string *)local_578);
    }
    else {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
                (local_470,(char (*) [2])0x40fecd,&(entry_func->super_IVariant).self,
                 (char (*) [6])"_init");
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_490,this,pSStack_28,0);
      (*(this->super_Compiler)._vptr_Compiler[0x27])(local_4d0 + 0x20,this,pSStack_28,0);
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&entry_func->arguments);
      to_expression_abi_cxx11_((CompilerGLSL *)local_4d0,uVar2,SUB41(uVar5,0));
      statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,(char (*) [7])0x41738f,local_490,(char (*) [2])0x40c6cb,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_4d0 + 0x20),(char (*) [4])0x4247a7,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d0,
                 (char (*) [2])0x42463b);
      ::std::__cxx11::string::~string((string *)local_4d0);
      ::std::__cxx11::string::~string((string *)(local_4d0 + 0x20));
      ::std::__cxx11::string::~string((string *)local_490);
      pSVar7 = type + 2;
      ::std::__cxx11::string::string((string *)&local_520,(string *)local_470);
      local_520.var = (SPIRVariable *)entry_func;
      local_520.this = this;
      ::std::function<void()>::
      function<spirv_cross::CompilerGLSL::emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::__1,void>
                ((function<void()> *)&local_4f0,&local_520);
      SmallVector<std::function<void_()>,_0UL>::push_back
                ((SmallVector<std::function<void_()>,_0UL> *)pSVar7,&local_4f0);
      ::std::function<void_()>::~function(&local_4f0);
      emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::$_1::~__1
                ((__1 *)&local_520);
      ::std::__cxx11::string::~string((string *)local_470);
    }
  }
  else {
    sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      (&(pSStack_28->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
    array_size = (uint32_t)sVar6;
    sVar6 = VectorView<unsigned_int>::size(&(pSStack_28->array).super_VectorView<unsigned_int>);
    iteration_count._3_1_ = sVar6 == 1;
    i = 1;
    if ((bool)iteration_count._3_1_) {
      i = to_array_size_literal(this,pSStack_28);
    }
    if ((type_is_array & 1U) == 0) {
      local_644 = i;
    }
    else {
      local_644 = 1;
    }
    local_4c = local_644;
    for (local_50 = 0; local_50 < array_size; local_50 = local_50 + 1) {
      TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_28->super_IVariant).self);
      bVar1 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)TVar4.id,local_50,DecorationBuiltIn);
      if (bVar1) {
        TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_28->super_IVariant).self);
        uVar5 = Compiler::get_member_decoration
                          (&this->super_Compiler,TVar4.id,local_50,DecorationBuiltIn);
        bVar1 = false;
        if (uVar5 == 4) {
          bVar1 = (this->super_Compiler).cull_distance_count == 0;
        }
        if (!bVar1) {
          TVar4 = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_28->super_IVariant).self);
          uVar5 = Compiler::get_member_decoration
                            (&this->super_Compiler,TVar4.id,local_50,DecorationBuiltIn);
          bVar1 = false;
          if (uVar5 == 3) {
            bVar1 = (this->super_Compiler).clip_distance_count == 0;
          }
          if (!bVar1) goto LAB_00171eb6;
        }
      }
      else {
LAB_00171eb6:
        ::std::__cxx11::string::string(local_80);
        if ((iteration_count._3_1_ & 1) != 0) {
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],unsigned_int&,char_const(&)[6]>
                    (local_a0,(char (*) [2])0x40fecd,&(entry_func->super_IVariant).self,
                     (char (*) [2])0x40fecd,&local_50,(char (*) [6])"_init");
          ::std::__cxx11::string::operator=(local_80,(string *)local_a0);
          ::std::__cxx11::string::~string((string *)local_a0);
          uVar5 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(entry_func->super_IVariant).field_0xc);
          pSVar7 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar5);
          pTVar8 = (TypedID *)
                   VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                             (&(pSVar7->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                              (ulong)local_50);
          uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar8);
          array_type.member_name_cache._M_h._M_single_bucket =
               (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar5);
          SPIRType::SPIRType((SPIRType *)local_218,
                             (SPIRType *)array_type.member_name_cache._M_h._M_single_bucket);
          TypedID<(spirv_cross::Types)1>::TypedID
                    ((TypedID<(spirv_cross::Types)1> *)(exprs.stack_storage.aligned_char + 0xfc),
                     uVar5);
          array_type.image.access._0_1_ = exprs.stack_storage.aligned_char[0xfc];
          array_type.image.access._1_1_ = exprs.stack_storage.aligned_char[0xfd];
          array_type.image.access._2_1_ = exprs.stack_storage.aligned_char[0xfe];
          array_type.image.access._3_1_ = exprs.stack_storage.aligned_char[0xff];
          array_type.super_IVariant._vptr_IVariant._4_4_ = 0x1c;
          SmallVector<unsigned_int,_8UL>::push_back
                    ((SmallVector<unsigned_int,_8UL> *)&array_type.vecsize,&i);
          exprs.stack_storage.aligned_char[0xfb] = '\x01';
          SmallVector<bool,_8UL>::push_back
                    ((SmallVector<bool,_8UL> *)(array_type.array.stack_storage.aligned_char + 0x18),
                     (bool *)(exprs.stack_storage.aligned_char + 0xfb));
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&c);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::reserve((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)&c,(ulong)i);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&entry_func->arguments);
          register0x00000000 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5)
          ;
          for (local_368._36_4_ = 0; (uint)local_368._36_4_ < i;
              local_368._36_4_ = local_368._36_4_ + 1) {
            pTVar8 = (TypedID *)
                     VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                               (&(stack0xfffffffffffffcc0->subconstants).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>,
                                (ulong)(uint)local_368._36_4_);
            uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar8);
            pSVar9 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar5);
            pTVar8 = (TypedID *)
                     VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                               (&(pSVar9->subconstants).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>,
                                (ulong)local_50);
            uVar5 = TypedID::operator_cast_to_unsigned_int(pTVar8);
            to_expression_abi_cxx11_((CompilerGLSL *)local_368,uVar2,SUB41(uVar5,0));
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                         *)&c,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_368);
            ::std::__cxx11::string::~string((string *)local_368);
          }
          (*(this->super_Compiler)._vptr_Compiler[0x13])(local_388,this,local_218,0);
          (*(this->super_Compiler)._vptr_Compiler[0x27])(local_3c8 + 0x20,this,local_218,0);
          type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_3c8,(SPIRType *)this);
          merge(local_3e8,
                (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)&c,", ");
          statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                    (this,(char (*) [7])0x41738f,local_388,(char (*) [2])0x40c6cb,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_3c8 + 0x20),(char (*) [4])0x4247a7,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8,
                     (char (*) [2])0x422b6e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8,
                     (char (*) [3])0x40acad);
          ::std::__cxx11::string::~string((string *)local_3e8);
          ::std::__cxx11::string::~string((string *)local_3c8);
          ::std::__cxx11::string::~string((string *)(local_3c8 + 0x20));
          ::std::__cxx11::string::~string((string *)local_388);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                          *)&c);
          SPIRType::~SPIRType((SPIRType *)local_218);
        }
        for (local_3ec = 0; local_3ec < local_4c; local_3ec = local_3ec + 1) {
          pSVar7 = type + 2;
          local_450.var = (SPIRVariable *)entry_func;
          local_450.is_control_point = (bool)(type_is_array & 1);
          local_450.i = local_50;
          local_450.is_patch = (bool)(is_block & 1);
          local_450.type_is_array = (bool)(iteration_count._3_1_ & 1);
          local_450.j = local_3ec;
          local_450.this = this;
          ::std::__cxx11::string::string((string *)&local_450.lut_name,local_80);
          ::std::function<void()>::
          function<spirv_cross::CompilerGLSL::emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::__0,void>
                    ((function<void()> *)&local_410,&local_450);
          SmallVector<std::function<void_()>,_0UL>::push_back
                    ((SmallVector<std::function<void_()>,_0UL> *)pSVar7,&local_410);
          ::std::function<void_()>::~function(&local_410);
          emit_output_variable_initializer(spirv_cross::SPIRVariable_const&)::$_0::~__0
                    ((__0 *)&local_450);
        }
        ::std::__cxx11::string::~string(local_80);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::emit_output_variable_initializer(const SPIRVariable &var)
{
	// If a StorageClassOutput variable has an initializer, we need to initialize it in main().
	auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
	auto &type = get<SPIRType>(var.basetype);
	bool is_patch = has_decoration(var.self, DecorationPatch);
	bool is_block = has_decoration(type.self, DecorationBlock);
	bool is_control_point = get_execution_model() == ExecutionModelTessellationControl && !is_patch;

	if (is_block)
	{
		uint32_t member_count = uint32_t(type.member_types.size());
		bool type_is_array = type.array.size() == 1;
		uint32_t array_size = 1;
		if (type_is_array)
			array_size = to_array_size_literal(type);
		uint32_t iteration_count = is_control_point ? 1 : array_size;

		// If the initializer is a block, we must initialize each block member one at a time.
		for (uint32_t i = 0; i < member_count; i++)
		{
			// These outputs might not have been properly declared, so don't initialize them in that case.
			if (has_member_decoration(type.self, i, DecorationBuiltIn))
			{
				if (get_member_decoration(type.self, i, DecorationBuiltIn) == BuiltInCullDistance &&
				    !cull_distance_count)
					continue;

				if (get_member_decoration(type.self, i, DecorationBuiltIn) == BuiltInClipDistance &&
				    !clip_distance_count)
					continue;
			}

			// We need to build a per-member array first, essentially transposing from AoS to SoA.
			// This code path hits when we have an array of blocks.
			string lut_name;
			if (type_is_array)
			{
				lut_name = join("_", var.self, "_", i, "_init");
				uint32_t member_type_id = get<SPIRType>(var.basetype).member_types[i];
				auto &member_type = get<SPIRType>(member_type_id);
				auto array_type = member_type;
				array_type.parent_type = member_type_id;
				array_type.op = OpTypeArray;
				array_type.array.push_back(array_size);
				array_type.array_size_literal.push_back(true);

				SmallVector<string> exprs;
				exprs.reserve(array_size);
				auto &c = get<SPIRConstant>(var.initializer);
				for (uint32_t j = 0; j < array_size; j++)
					exprs.push_back(to_expression(get<SPIRConstant>(c.subconstants[j]).subconstants[i]));
				statement("const ", type_to_glsl(array_type), " ", lut_name, type_to_array_glsl(array_type, 0), " = ",
				          type_to_glsl_constructor(array_type), "(", merge(exprs, ", "), ");");
			}

			for (uint32_t j = 0; j < iteration_count; j++)
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					AccessChainMeta meta;
					auto &c = this->get<SPIRConstant>(var.initializer);

					uint32_t invocation_id = 0;
					uint32_t member_index_id = 0;
					if (is_control_point)
					{
						uint32_t ids = ir.increase_bound_by(3);
						auto &uint_type = set<SPIRType>(ids, OpTypeInt);
						uint_type.basetype = SPIRType::UInt;
						uint_type.width = 32;
						set<SPIRExpression>(ids + 1, builtin_to_glsl(BuiltInInvocationId, StorageClassInput), ids, true);
						set<SPIRConstant>(ids + 2, ids, i, false);
						invocation_id = ids + 1;
						member_index_id = ids + 2;
					}

					if (is_patch)
					{
						statement("if (gl_InvocationID == 0)");
						begin_scope();
					}

					if (type_is_array && !is_control_point)
					{
						uint32_t indices[2] = { j, i };
						auto chain = access_chain_internal(var.self, indices, 2, ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &meta);
						statement(chain, " = ", lut_name, "[", j, "];");
					}
					else if (is_control_point)
					{
						uint32_t indices[2] = { invocation_id, member_index_id };
						auto chain = access_chain_internal(var.self, indices, 2, 0, &meta);
						statement(chain, " = ", lut_name, "[", builtin_to_glsl(BuiltInInvocationId, StorageClassInput), "];");
					}
					else
					{
						auto chain =
								access_chain_internal(var.self, &i, 1, ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &meta);
						statement(chain, " = ", to_expression(c.subconstants[i]), ";");
					}

					if (is_patch)
						end_scope();
				});
			}
		}
	}
	else if (is_control_point)
	{
		auto lut_name = join("_", var.self, "_init");
		statement("const ", type_to_glsl(type), " ", lut_name, type_to_array_glsl(type, 0),
		          " = ", to_expression(var.initializer), ";");
		entry_func.fixup_hooks_in.push_back([&, lut_name]() {
			statement(to_expression(var.self), "[gl_InvocationID] = ", lut_name, "[gl_InvocationID];");
		});
	}
	else if (has_decoration(var.self, DecorationBuiltIn) &&
	         BuiltIn(get_decoration(var.self, DecorationBuiltIn)) == BuiltInSampleMask)
	{
		// We cannot copy the array since gl_SampleMask is unsized in GLSL. Unroll time! <_<
		entry_func.fixup_hooks_in.push_back([&] {
			auto &c = this->get<SPIRConstant>(var.initializer);
			uint32_t num_constants = uint32_t(c.subconstants.size());
			for (uint32_t i = 0; i < num_constants; i++)
			{
				// Don't use to_expression on constant since it might be uint, just fish out the raw int.
				statement(to_expression(var.self), "[", i, "] = ",
				          convert_to_string(this->get<SPIRConstant>(c.subconstants[i]).scalar_i32()), ";");
			}
		});
	}
	else
	{
		auto lut_name = join("_", var.self, "_init");
		statement("const ", type_to_glsl(type), " ", lut_name,
		          type_to_array_glsl(type, var.self), " = ", to_expression(var.initializer), ";");
		entry_func.fixup_hooks_in.push_back([&, lut_name, is_patch]() {
			if (is_patch)
			{
				statement("if (gl_InvocationID == 0)");
				begin_scope();
			}
			statement(to_expression(var.self), " = ", lut_name, ";");
			if (is_patch)
				end_scope();
		});
	}
}